

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_ptr<char,fmt::v8::appender,unsigned_long>
                   (appender out,unsigned_long value,basic_format_specs<char> *specs)

{
  int value_00;
  type tVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_30;
  
  value_00 = count_digits<4,unsigned_long>(value);
  tVar1 = to_unsigned<int>(value_00);
  local_30.value = value;
  local_30.num_digits = value_00;
  if (specs == (basic_format_specs<char> *)0x0) {
    bVar2.container =
         (buffer<char> *)
         write_ptr<char,_fmt::v8::appender,_unsigned_long>::anon_class_16_2_92d121e5::operator()
                   (&local_30,
                    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
  }
  else {
    bVar2.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_ptr<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,unsigned_long,fmt::v8::basic_format_specs<char>const*)::_lambda(fmt::v8::appender)_1_&>
                   (out,specs,(ulong)tVar1 + 2,&local_30);
  }
  return (appender)bVar2.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}